

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.cpp
# Opt level: O1

gfield * __thiscall gfield::pow<13,13>(gfield *this,bigint<13> *x,bigint<13> *y)

{
  undefined4 uVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  digit dVar5;
  digit dVar6;
  uint uVar7;
  ushort uVar8;
  uint uVar9;
  uint uVar10;
  gfield a;
  bigint<26> result;
  gfint gStack_88;
  bigint<26> local_68;
  
  gStack_88.len = x->len;
  gStack_88.digits[0] = x->digits[0];
  gStack_88.digits[1] = x->digits[1];
  gStack_88.digits._18_8_ = *(undefined8 *)(x->digits + 9);
  gStack_88.digits._12_6_ = SUB86((ulong)*(undefined8 *)(x->digits + 5) >> 0x10,0);
  gStack_88.digits._4_6_ = SUB86(*(undefined8 *)(x->digits + 2),0);
  gStack_88.digits[5] = (digit)((ulong)*(undefined8 *)(x->digits + 2) >> 0x30);
  if ((y->len < 1) || ((y->digits[0] & 1) == 0)) {
    (this->super_gfint).len = 1;
    (this->super_gfint).digits[0] = 1;
    if (y->len == 0) {
      return this;
    }
  }
  else {
    iVar2 = x->len;
    dVar5 = x->digits[0];
    dVar6 = x->digits[1];
    uVar4 = *(undefined8 *)(x->digits + 2);
    uVar3 = *(undefined8 *)(x->digits + 6);
    uVar1 = *(undefined4 *)(x->digits + 10);
    (this->super_gfint).digits[0xc] = x->digits[0xc];
    *(undefined4 *)((this->super_gfint).digits + 10) = uVar1;
    *(undefined8 *)((this->super_gfint).digits + 6) = uVar3;
    (this->super_gfint).len = iVar2;
    (this->super_gfint).digits[0] = dVar5;
    (this->super_gfint).digits[1] = dVar6;
    *(undefined8 *)((this->super_gfint).digits + 2) = uVar4;
  }
  iVar2 = y->len;
  uVar10 = 0;
  if ((long)iVar2 != 0) {
    uVar7 = iVar2 << 4;
    uVar9 = 0x8000;
    do {
      uVar8 = (ushort)uVar9;
      uVar10 = uVar7;
      if ((uVar8 & y->digits[(long)iVar2 + -1]) != 0) break;
      uVar7 = uVar7 - 1;
      uVar9 = uVar9 >> 1;
      uVar10 = 0;
    } while (1 < uVar8);
  }
  if (1 < (int)uVar10) {
    uVar7 = 1;
    do {
      bigint<26>::mul<13,13>(&local_68,&gStack_88,&gStack_88);
      reduce<26>((gfield *)&gStack_88,&local_68);
      if (((int)(uVar7 >> 4) < y->len) && ((y->digits[uVar7 >> 4] >> (uVar7 & 0xf) & 1) != 0)) {
        bigint<26>::mul<13,13>(&local_68,&this->super_gfint,&gStack_88);
        reduce<26>(this,&local_68);
      }
      uVar7 = uVar7 + 1;
    } while (uVar10 != uVar7);
  }
  return this;
}

Assistant:

gfield &pow(const bigint<X_DIGITS> &x, const bigint<Y_DIGITS> &y)
    {
        gfield a(x);
        if(y.hasbit(0)) *this = a;
        else
        {
            len = 1;
            digits[0] = 1;
            if(!y.len) return *this;
        }
        for(int i = 1, j = y.numbits(); i < j; i++)
        {
            a.square();
            if(y.hasbit(i)) mul(a);
        }
        return *this;
    }